

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::WriteObjectRuleFiles
          (cmMakefileTargetGenerator *this,cmSourceFile *source)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  cmTarget *tgt;
  cmLocalUnixMakefileGenerator3 *this_01;
  bool bVar1;
  ulong uVar2;
  string *psVar3;
  ostream *poVar4;
  char *pcVar5;
  char *src;
  undefined1 local_318 [8];
  string srcFullPath;
  allocator local_2d1;
  undefined1 local_2d0 [8];
  string objFullPath;
  string depMakeFile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  undefined1 local_258 [8];
  string dir;
  undefined1 local_218 [8];
  ostringstream err;
  _Self local_90;
  _Self local_88;
  undefined1 local_80 [8];
  string obj;
  string *objectName;
  string local_40;
  string *local_20;
  string *lang;
  cmSourceFile *source_local;
  cmMakefileTargetGenerator *this_local;
  
  lang = (string *)source;
  source_local = (cmSourceFile *)this;
  cmLocalGenerator::GetSourceFileLanguage_abi_cxx11_
            (&local_40,&this->LocalGenerator->super_cmLocalGenerator,source);
  local_20 = &local_40;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    psVar3 = cmGeneratorTarget::GetObjectName_abi_cxx11_(this->GeneratorTarget,(cmSourceFile *)lang)
    ;
    (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[0xc])
              (local_80,this->LocalGenerator,this->Target);
    std::__cxx11::string::operator+=((string *)local_80,"/");
    std::__cxx11::string::operator+=((string *)local_80,(string *)psVar3);
    local_88._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&this->ObjectFiles,(key_type *)local_80);
    local_90._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->ObjectFiles);
    bVar1 = std::operator==(&local_88,&local_90);
    if (bVar1) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&this->ObjectFiles,(value_type *)local_80);
      cmsys::SystemTools::GetFilenamePath((string *)local_258,(string *)local_80);
      cmLocalUnixMakefileGenerator3::ConvertToFullPath
                ((string *)
                 &depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,this->LocalGenerator,
                 (string *)local_258);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmsys::SystemTools::MakeDirectory(pcVar5);
      std::__cxx11::string::~string
                ((string *)
                 &depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->Objects,(value_type *)local_80);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->CleanFiles,(value_type *)local_80);
      this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&depMakeFile.field_2 + 8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(this_00);
      std::__cxx11::string::string((string *)(objFullPath.field_2._M_local_buf + 8));
      WriteObjectBuildFile(this,(string *)local_80,local_20,(cmSourceFile *)lang,this_00);
      pcVar5 = cmMakefile::GetCurrentBinaryDirectory(this->Makefile);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_2d0,pcVar5,&local_2d1);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
      std::__cxx11::string::operator+=((string *)local_2d0,"/");
      std::__cxx11::string::operator+=((string *)local_2d0,(string *)local_80);
      Convert((string *)((long)&srcFullPath.field_2 + 8),this,(string *)local_2d0,FULL,UNCHANGED);
      std::__cxx11::string::operator=
                ((string *)local_2d0,(string *)(srcFullPath.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(srcFullPath.field_2._M_local_buf + 8));
      psVar3 = cmSourceFile::GetFullPath_abi_cxx11_((cmSourceFile *)lang);
      Convert((string *)local_318,this,psVar3,FULL,UNCHANGED);
      psVar3 = local_20;
      tgt = this->Target;
      this_01 = this->LocalGenerator;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      src = (char *)std::__cxx11::string::c_str();
      cmLocalUnixMakefileGenerator3::AddImplicitDepends(this_01,tgt,psVar3,pcVar5,src);
      std::__cxx11::string::~string((string *)local_318);
      std::__cxx11::string::~string((string *)local_2d0);
      std::__cxx11::string::~string((string *)(objFullPath.field_2._M_local_buf + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&depMakeFile.field_2 + 8));
      std::__cxx11::string::~string((string *)local_258);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
      poVar4 = std::operator<<((ostream *)local_218,"Warning: Source file \"");
      psVar3 = cmSourceFile::GetFullPath_abi_cxx11_((cmSourceFile *)lang);
      poVar4 = std::operator<<(poVar4,(string *)psVar3);
      poVar4 = std::operator<<(poVar4,"\" is listed multiple times for target \"");
      psVar3 = cmTarget::GetName_abi_cxx11_(this->Target);
      poVar4 = std::operator<<(poVar4,(string *)psVar3);
      std::operator<<(poVar4,"\".");
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Message(pcVar5,"Warning");
      std::__cxx11::string::~string((string *)(dir.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
    }
    std::__cxx11::string::~string((string *)local_80);
  }
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmMakefileTargetGenerator
::WriteObjectRuleFiles(cmSourceFile const& source)
{
  // Identify the language of the source file.
  const std::string& lang =
    this->LocalGenerator->GetSourceFileLanguage(source);
  if(lang.empty())
    {
    // don't know anything about this file so skip it
    return;
    }

  // Get the full path name of the object file.
  std::string const& objectName = this->GeneratorTarget
                                      ->GetObjectName(&source);
  std::string obj = this->LocalGenerator->GetTargetDirectory(*this->Target);
  obj += "/";
  obj += objectName;

  // Avoid generating duplicate rules.
  if(this->ObjectFiles.find(obj) == this->ObjectFiles.end())
    {
    this->ObjectFiles.insert(obj);
    }
  else
    {
    std::ostringstream err;
    err << "Warning: Source file \""
        << source.GetFullPath()
        << "\" is listed multiple times for target \""
        << this->Target->GetName()
        << "\".";
    cmSystemTools::Message(err.str().c_str(), "Warning");
    return;
    }

  // Create the directory containing the object file.  This may be a
  // subdirectory under the target's directory.
  std::string dir = cmSystemTools::GetFilenamePath(obj);
  cmSystemTools::MakeDirectory
    (this->LocalGenerator->ConvertToFullPath(dir).c_str());

  // Save this in the target's list of object files.
  this->Objects.push_back(obj);
  this->CleanFiles.push_back(obj);

  // TODO: Remove
  //std::string relativeObj
  //= this->LocalGenerator->GetHomeRelativeOutputPath();
  //relativeObj += obj;

  // we compute some depends when writing the depend.make that we will also
  // use in the build.make, same with depMakeFile
  std::vector<std::string> depends;
  std::string depMakeFile;

  // generate the build rule file
  this->WriteObjectBuildFile(obj, lang, source, depends);

  // The object file should be checked for dependency integrity.
  std::string objFullPath = this->Makefile->GetCurrentBinaryDirectory();
  objFullPath += "/";
  objFullPath += obj;
  objFullPath =
    this->Convert(objFullPath, cmLocalGenerator::FULL);
  std::string srcFullPath =
    this->Convert(source.GetFullPath(), cmLocalGenerator::FULL);
  this->LocalGenerator->
    AddImplicitDepends(*this->Target, lang,
                       objFullPath.c_str(),
                       srcFullPath.c_str());
}